

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_product_definition_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  char *name;
  char *pcVar4;
  coda_product_definition *current_product_definition;
  long in_FS_OFFSET;
  int version;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  name = get_mandatory_attribute_value(attr,"id",info->node->tag);
  iVar3 = -1;
  if (((name != (char *)0x0) &&
      (pcVar4 = get_mandatory_attribute_value(attr,"format",info->node->tag), pcVar4 != (char *)0x0)
      ) && (iVar2 = coda_format_from_string(pcVar4,&info->node->format), iVar2 == 0)) {
    pnVar1 = info->node;
    pnVar1->format_set = 1;
    pcVar4 = get_mandatory_attribute_value(attr,"version",pnVar1->tag);
    if (pcVar4 != (char *)0x0) {
      iVar2 = __isoc99_sscanf(pcVar4,"%d",&local_24);
      if (iVar2 == 1) {
        pnVar1 = info->node;
        pnVar1->free_data = coda_product_definition_delete;
        current_product_definition = coda_product_definition_new(name,pnVar1->format,local_24);
        info->product_definition = current_product_definition;
        if (current_product_definition != (coda_product_definition *)0x0) {
          if (*(int *)(in_FS_OFFSET + -0xe4) != 0) {
            iVar3 = parse_entry(info->zf,ze_product,name,info->product_class,
                                current_product_definition);
            current_product_definition = info->product_definition;
            if (iVar3 != 0) {
              coda_product_definition_delete(current_product_definition);
              info->product_definition = (coda_product_definition *)0x0;
              info->add_error_location = 0;
              return -1;
            }
          }
          pnVar1 = info->node;
          pnVar1->data = current_product_definition;
          pnVar1->init_sub_element[0xb] = string_data_init;
          pnVar1->add_element_to_parent[0xb] = cd_product_definition_set_description;
          pnVar1 = info->node;
          pnVar1->init_sub_element[0xc] = cd_detection_rule_init;
          pnVar1->add_element_to_parent[0xc] = cd_product_definition_add_detection_rule;
          iVar3 = 0;
        }
      }
      else {
        coda_set_error(-400,"invalid \'version\' attribute value \'%s\'",pcVar4);
      }
    }
  }
  return iVar3;
}

Assistant:

static int cd_product_definition_init(parser_info *info, const char **attr)
{
    const char *id;
    const char *format_string;
    const char *version_string;
    int version;

    id = get_mandatory_attribute_value(attr, "id", info->node->tag);
    if (id == NULL)
    {
        return -1;
    }
    format_string = get_mandatory_attribute_value(attr, "format", info->node->tag);
    if (format_string == NULL)
    {
        return -1;
    }
    if (coda_format_from_string(format_string, &info->node->format) != 0)
    {
        return -1;
    }
    info->node->format_set = 1;
    version_string = get_mandatory_attribute_value(attr, "version", info->node->tag);
    if (version_string == NULL)
    {
        return -1;
    }
    if (sscanf(version_string, "%d", &version) != 1)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid 'version' attribute value '%s'", version_string);
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_product_definition_delete;
    info->product_definition = coda_product_definition_new(id, info->node->format, version);
    if (info->product_definition == NULL)
    {
        return -1;
    }
    if (coda_option_read_all_definitions)
    {
        if (parse_entry(info->zf, ze_product, id, info->product_class, info->product_definition) != 0)
        {
            coda_product_definition_delete(info->product_definition);
            info->product_definition = NULL;
            info->add_error_location = 0;
            return -1;
        }
    }
    info->node->data = info->product_definition;

    register_sub_element(info->node, element_cd_description, string_data_init, cd_product_definition_set_description);
    register_sub_element(info->node, element_cd_detection_rule, cd_detection_rule_init,
                         cd_product_definition_add_detection_rule);

    return 0;
}